

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

void __thiscall
TidyConfigParser::toggleAllGroupChecks(TidyConfigParser *this,string *groupName,CheckStatus status)

{
  optional<slang::TidyKind> oVar1;
  undefined8 extraout_RAX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  string_view fmt;
  string sStack_78;
  pointer local_58;
  size_type sStack_50;
  string local_40;
  
  std::__cxx11::string::string((string *)&sStack_78,groupName);
  oVar1 = slang::tidyKindFromStr(&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  if (((ulong)oVar1.super__Optional_base<slang::TidyKind,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TidyKind> >> 0x20 & 1) != 0) {
    TidyConfig::toggleGroup
              (&this->config,
               oVar1.super__Optional_base<slang::TidyKind,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TidyKind>._M_payload,status);
    return;
  }
  local_58 = (groupName->_M_dataplus)._M_p;
  sStack_50 = groupName->_M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_58;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x17;
  ::fmt::v11::vformat_abi_cxx11_(&local_40,(v11 *)"Group {} does not exist",fmt,args);
  reportErrorAndExit(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TidyConfigParser::toggleAllGroupChecks(const std::string& groupName,
                                            TidyConfig::CheckStatus status) {
    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));

    config.toggleGroup(kind.value(), status);
}